

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TagDeclaration_StructOrUnion.h
# Opt level: O2

void __thiscall
psy::C::StructOrUnionDeclarationSymbol::~StructOrUnionDeclarationSymbol
          (StructOrUnionDeclarationSymbol *this)

{
  TagDeclarationSymbol::~TagDeclarationSymbol(&this->super_TagDeclarationSymbol);
  operator_delete(this,0x28);
  return;
}

Assistant:

class PSY_C_API StructOrUnionDeclarationSymbol : public TagDeclarationSymbol
{
public:
    using Fields = std::vector<const FieldDeclarationSymbol*>;

    //!@{
    /**
     * Cast \c this Symbol as a TagDeclarationSymbol.
     */
    virtual StructOrUnionDeclarationSymbol* asStructOrUnionDeclaration() override { return this; }
    virtual const StructOrUnionDeclarationSymbol* asStructOrUnionDeclaration() const override { return this; }
    //!@}

    /**
     * The \a fields of \c this StructOrUnionDeclarationSymbol.
     */
    Fields fields() const;

PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(DeclarationBinder);

    void addField(const FieldDeclarationSymbol* fld);

protected:
    StructOrUnionDeclarationSymbol(
            SymbolKind symK,
            const Symbol* containingSym,
            const SyntaxTree* tree,
            const Scope* enclosingScope,
            TagType* tagTy);
}